

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O0

void write2Dfield(char *fileName,double **field,size_t sizeX,size_t sizeY,size_t offX,size_t offY,
                 char *mode)

{
  FILE *__s;
  size_t in_RCX;
  ulong in_RDX;
  long in_RSI;
  char *in_RDI;
  long in_R8;
  long in_R9;
  size_t i;
  FILE *out;
  ulong local_40;
  size_t local_20;
  ulong local_18;
  long local_10;
  char *local_8;
  
  if (in_RSI == 0) {
    printf("The field is invalid.\n");
  }
  else {
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    __s = fopen(in_RDI,(char *)i);
    if (__s == (FILE *)0x0) {
      printf("The file %s could not be opened.\n",local_8);
    }
    else {
      fwrite(&local_18,8,1,__s);
      fwrite(&local_20,8,1,__s);
      for (local_40 = 0; local_40 < local_18; local_40 = local_40 + 1) {
        fwrite((void *)(*(long *)(local_10 + (local_40 + in_R8) * 8) + in_R9 * 8),8,local_20,__s);
      }
      fclose(__s);
    }
  }
  return;
}

Assistant:

void write2Dfield (const char* fileName, REAL** field, size_t sizeX, size_t sizeY, size_t offX, size_t offY, const char *mode)
{
	if (field == NULL)
	{
		printf("The field is invalid.\n");
		return;
	}
	FILE *out = fopen(fileName,mode);
	if (out == NULL)
	{
		printf("The file %s could not be opened.\n",fileName);
		return;
	}
	fwrite(&sizeX,sizeof(size_t),1,out);
	fwrite(&sizeY,sizeof(size_t),1,out);
	for (size_t i = 0; i < sizeX; i++)
	{
		fwrite(field[i+offX]+offY,sizeof(REAL),sizeY,out);
	}
	fclose(out);
	return;
}